

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

void Flatten(ON_PolyCurve *poly,ON_Interval pdom,ON_SimpleArray<double> *new_t,
            ON_SimpleArray<ON_Curve_*> *new_seg)

{
  ON_PolyCurve *poly_00;
  bool bVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  ON_Curve *seg;
  double t1;
  ON_Interval pcdom;
  double local_80;
  ON_PolyCurve *local_78;
  ON_Interval local_70;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  dVar5 = pdom.m_t[1];
  local_40.m_t[0] = pdom.m_t[0];
  lVar3 = (long)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_40.m_t[1] = dVar5;
  pdVar2 = ON_Interval::operator[](&local_40,0);
  local_80 = *pdVar2;
  (*(poly->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(poly);
  if (0 < lVar3) {
    lVar4 = 0;
    local_50.m_t[1] = dVar5;
    do {
      local_70 = ON_PolyCurve::SegmentDomain(poly,(int)lVar4);
      pdVar2 = ON_Interval::operator[](&local_70,1);
      dVar5 = ON_Interval::NormalizedParameterAt(&local_50,*pdVar2);
      dVar5 = ON_Interval::ParameterAt(&local_40,dVar5);
      local_70.m_t[0] = dVar5;
      if (lVar4 < (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
        poly_00 = (ON_PolyCurve *)(poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4];
        local_78 = poly_00;
        if (poly_00 == (ON_PolyCurve *)0x0) goto LAB_0058c92e;
        bVar1 = ON_Object::IsKindOf((ON_Object *)poly_00,&ON_PolyCurve::m_ON_PolyCurve_class_rtti);
        if (!bVar1) goto LAB_0058c92e;
        ON_Interval::ON_Interval(&local_60,local_80,local_70.m_t[0]);
        Flatten(poly_00,local_60,new_t,new_seg);
        if (lVar4 < (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
          (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4] = (ON_Curve *)0x0;
        }
        (*(poly_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(poly_00);
      }
      else {
        local_78 = (ON_PolyCurve *)0x0;
LAB_0058c92e:
        ON_SimpleArray<double>::Append(new_t,local_70.m_t);
        ON_SimpleArray<ON_Curve_*>::Append(new_seg,(ON_Curve **)&local_78);
        if (lVar4 < (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
          (poly->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4] = (ON_Curve *)0x0;
        }
      }
      local_80 = local_70.m_t[0];
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

static
void Flatten( ON_PolyCurve* poly, ON_Interval pdom, ON_SimpleArray<double>& new_t, ON_SimpleArray<ON_Curve*>& new_seg){
		int n= poly->Count();
		double t0 = pdom[0];
		ON_Interval pcdom = poly->Domain();
		for(int i=0; i<n; i++){
			double sdom=poly->SegmentDomain(i)[1];
			double ndom=pcdom.NormalizedParameterAt(sdom);	
			double t1 =pdom.ParameterAt(ndom);
			ON_Curve* seg = poly->SegmentCurve(i);
			ON_PolyCurve* spoly =  ON_PolyCurve::Cast(seg);
			if(spoly){
				Flatten(spoly, ON_Interval(t0,t1), new_t, new_seg );
				poly->HarvestSegment(i);		
				delete spoly;
			} else {
				new_t.Append(t1);
				new_seg.Append(seg);
				poly->HarvestSegment(i);
			}
			t0 = t1;
		}
}